

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

void __thiscall SQCompiler::ForStatement(SQCompiler *this)

{
  SQUnsignedInteger *pSVar1;
  SQUnsignedInteger SVar2;
  SQInstruction *pSVar3;
  SQUnsignedInteger SVar4;
  uint uVar5;
  SQInteger SVar6;
  longlong *plVar7;
  ulong uVar8;
  ulong pos;
  SQFuncState *pSVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  SQUnsignedInteger SVar13;
  SQFuncState *pSVar14;
  SQUnsignedInteger SVar15;
  SQInstructionVec exp;
  SQScope __oldscope__;
  sqvector<SQInstruction> local_78;
  SQUnsignedInteger local_60;
  long local_58;
  SQInstruction local_50;
  SQInteger local_48;
  SQInteger SStack_40;
  
  SVar6 = SQLexer::Lex(&this->_lex);
  this->_token = SVar6;
  local_48 = (this->_scope).outers;
  SStack_40 = (this->_scope).stacksize;
  pSVar9 = this->_fs;
  (this->_scope).outers = pSVar9->_outers;
  SVar6 = SQFuncState::GetStackSize(pSVar9);
  (this->_scope).stacksize = SVar6;
  Expect(this,0x28);
  if (this->_token != 0x3b) {
    if (this->_token == 0x11b) {
      LocalDeclStatement(this);
    }
    else {
      CommaExpr(this);
      SQFuncState::PopTarget(this->_fs);
    }
  }
  Expect(this,0x3b);
  pSVar9 = this->_fs;
  pSVar9->_optimization = false;
  local_60 = (pSVar9->_instructions)._size;
  pos = 0xffffffffffffffff;
  if (this->_token != 0x3b) {
    CommaExpr(this);
    pSVar9 = this->_fs;
    SVar6 = SQFuncState::PopTarget(pSVar9);
    local_78._vals._0_6_ = CONCAT15((char)SVar6,0x1e00000000);
    local_78._vals = (SQInstruction *)((ulong)(ushort)((uint6)local_78._vals._0_6_ >> 0x20) << 0x20)
    ;
    SQFuncState::AddInstruction(pSVar9,(SQInstruction *)&local_78);
    pos = (this->_fs->_instructions)._size - 1;
  }
  Expect(this,0x3b);
  pSVar9 = this->_fs;
  pSVar9->_optimization = false;
  SVar15 = (pSVar9->_instructions)._size;
  if (this->_token != 0x29) {
    CommaExpr(this);
    SQFuncState::PopTarget(this->_fs);
  }
  Expect(this,0x29);
  pSVar9 = this->_fs;
  SVar2 = (pSVar9->_instructions)._size;
  lVar11 = SVar15 - SVar2;
  lVar12 = -lVar11;
  local_58 = SVar15 - SVar2;
  pSVar9->_optimization = false;
  local_78._vals = (SQInstruction *)0x0;
  local_78._size = 0;
  local_78._allocated = 0;
  if (local_58 < 0) {
    do {
      pSVar3 = (this->_fs->_instructions)._vals;
      if (local_78._allocated <= local_78._size) {
        uVar10 = local_78._size * 2;
        if (uVar10 == 0) {
          uVar10 = 4;
        }
        local_78._vals =
             (SQInstruction *)sq_vm_realloc(local_78._vals,local_78._allocated << 3,uVar10 * 8);
        local_78._allocated = uVar10;
      }
      uVar10 = local_78._size + 1;
      local_78._vals[local_78._size] = pSVar3[SVar15];
      SVar15 = SVar15 + 1;
      local_78._size = uVar10;
    } while (SVar2 != SVar15);
    pSVar9 = this->_fs;
    if (lVar12 != 0 && lVar11 < 1) {
      pSVar1 = &(pSVar9->_instructions)._size;
      *pSVar1 = *pSVar1 + lVar11;
    }
  }
  SVar15 = (pSVar9->_unresolvedbreaks)._size;
  SVar2 = (pSVar9->_unresolvedcontinues)._size;
  uVar10 = (pSVar9->_breaktargets)._allocated;
  uVar8 = (pSVar9->_breaktargets)._size;
  plVar7 = (pSVar9->_breaktargets)._vals;
  pSVar14 = pSVar9;
  if (uVar10 <= uVar8) {
    SVar13 = 4;
    if (uVar8 * 2 != 0) {
      SVar13 = uVar8 * 2;
    }
    plVar7 = (longlong *)sq_vm_realloc(plVar7,uVar10 << 3,SVar13 * 8);
    (pSVar9->_breaktargets)._vals = plVar7;
    (pSVar9->_breaktargets)._allocated = SVar13;
    uVar8 = (pSVar9->_breaktargets)._size;
    pSVar14 = this->_fs;
  }
  (pSVar9->_breaktargets)._size = uVar8 + 1;
  plVar7[uVar8] = 0;
  uVar10 = (pSVar14->_continuetargets)._allocated;
  plVar7 = (pSVar14->_continuetargets)._vals;
  uVar8 = (pSVar14->_continuetargets)._size;
  if (uVar10 <= uVar8) {
    SVar13 = 4;
    if (uVar8 * 2 != 0) {
      SVar13 = uVar8 * 2;
    }
    plVar7 = (longlong *)sq_vm_realloc(plVar7,uVar10 << 3,SVar13 * 8);
    (pSVar14->_continuetargets)._vals = plVar7;
    (pSVar14->_continuetargets)._allocated = SVar13;
    uVar8 = (pSVar14->_continuetargets)._size;
  }
  (pSVar14->_continuetargets)._size = uVar8 + 1;
  plVar7[uVar8] = 0;
  Statement(this,true);
  pSVar9 = this->_fs;
  SVar13 = (pSVar9->_instructions)._size;
  uVar5 = (uint)SVar13;
  if (local_58 < 0) {
    lVar11 = 0;
    do {
      SQFuncState::AddInstruction
                (this->_fs,(SQInstruction *)((long)&(local_78._vals)->_arg1 + lVar11));
      lVar11 = lVar11 + 8;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
    pSVar9 = this->_fs;
    uVar5 = (uint)(pSVar9->_instructions)._size;
  }
  local_50._arg1 = (int)local_60 + ~uVar5;
  local_50.op = '\x1c';
  local_50._arg0 = '\0';
  local_50._arg2 = '\0';
  local_50._arg3 = '\0';
  SQFuncState::AddInstruction(pSVar9,&local_50);
  if (0 < (long)pos) {
    SQFuncState::SetIntructionParam(this->_fs,pos,1,~pos + (this->_fs->_instructions)._size);
  }
  lVar11 = this->_fs->_outers;
  SVar6 = SQFuncState::GetStackSize(this->_fs);
  pSVar9 = this->_fs;
  lVar12 = (this->_scope).stacksize;
  if (SVar6 != lVar12) {
    SQFuncState::SetStackSize(pSVar9,lVar12);
    pSVar9 = this->_fs;
    if (lVar11 != pSVar9->_outers) {
      local_50._arg1 = (SQInt32)(this->_scope).stacksize;
      local_50.op = '<';
      local_50._arg0 = '\0';
      local_50._arg2 = '\0';
      local_50._arg3 = '\0';
      SQFuncState::AddInstruction(pSVar9,&local_50);
      pSVar9 = this->_fs;
    }
  }
  (this->_scope).outers = local_48;
  (this->_scope).stacksize = SStack_40;
  SVar4 = (pSVar9->_unresolvedbreaks)._size;
  lVar11 = (pSVar9->_unresolvedcontinues)._size - SVar2;
  if (0 < lVar11) {
    ResolveContinues(this,pSVar9,lVar11,SVar13 - 1);
    pSVar9 = this->_fs;
  }
  lVar11 = SVar4 - SVar15;
  if (0 < lVar11) {
    ResolveBreaks(this,pSVar9,lVar11);
    pSVar9 = this->_fs;
  }
  pSVar1 = &(pSVar9->_breaktargets)._size;
  *pSVar1 = *pSVar1 - 1;
  pSVar1 = &(pSVar9->_continuetargets)._size;
  *pSVar1 = *pSVar1 - 1;
  sqvector<SQInstruction>::~sqvector(&local_78);
  return;
}

Assistant:

void ForStatement()
    {
        Lex();
        BEGIN_SCOPE();
        Expect(_SC('('));
        if(_token == TK_LOCAL) LocalDeclStatement();
        else if(_token != _SC(';')){
            CommaExpr();
            _fs->PopTarget();
        }
        Expect(_SC(';'));
        _fs->SnoozeOpt();
        SQInteger jmppos = _fs->GetCurrentPos();
        SQInteger jzpos = -1;
        if(_token != _SC(';')) { CommaExpr(); _fs->AddInstruction(_OP_JZ, _fs->PopTarget()); jzpos = _fs->GetCurrentPos(); }
        Expect(_SC(';'));
        _fs->SnoozeOpt();
        SQInteger expstart = _fs->GetCurrentPos() + 1;
        if(_token != _SC(')')) {
            CommaExpr();
            _fs->PopTarget();
        }
        Expect(_SC(')'));
        _fs->SnoozeOpt();
        SQInteger expend = _fs->GetCurrentPos();
        SQInteger expsize = (expend - expstart) + 1;
        SQInstructionVec exp;
        if(expsize > 0) {
            for(SQInteger i = 0; i < expsize; i++)
                exp.push_back(_fs->GetInstruction(expstart + i));
            _fs->PopInstructions(expsize);
        }
        BEGIN_BREAKBLE_BLOCK()
        Statement();
        SQInteger continuetrg = _fs->GetCurrentPos();
        if(expsize > 0) {
            for(SQInteger i = 0; i < expsize; i++)
                _fs->AddInstruction(exp[i]);
        }
        _fs->AddInstruction(_OP_JMP, 0, jmppos - _fs->GetCurrentPos() - 1, 0);
        if(jzpos>  0) _fs->SetIntructionParam(jzpos, 1, _fs->GetCurrentPos() - jzpos);
        END_SCOPE();

        END_BREAKBLE_BLOCK(continuetrg);
    }